

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

DISPOSITION_HANDLE disposition_create(role role_value,delivery_number first_value)

{
  int iVar1;
  DISPOSITION_HANDLE disposition;
  AMQP_VALUE value;
  AMQP_VALUE item_value;
  AMQP_VALUE item_value_00;
  
  disposition = (DISPOSITION_HANDLE)malloc(8);
  if (disposition != (DISPOSITION_HANDLE)0x0) {
    value = amqpvalue_create_composite_with_ulong_descriptor(0x15);
    disposition->composite_value = value;
    if (value == (AMQP_VALUE)0x0) {
      free(disposition);
    }
    else {
      item_value = amqpvalue_create_boolean(role_value);
      iVar1 = amqpvalue_set_composite_item(value,0,item_value);
      item_value_00 = amqpvalue_create_uint(first_value);
      if (iVar1 == 0) {
        iVar1 = amqpvalue_set_composite_item(value,1,item_value_00);
        amqpvalue_destroy(item_value);
        amqpvalue_destroy(item_value_00);
        if (iVar1 == 0) {
          return disposition;
        }
      }
      else {
        amqpvalue_destroy(item_value);
        amqpvalue_destroy(item_value_00);
      }
      disposition_destroy(disposition);
    }
  }
  return (DISPOSITION_HANDLE)0x0;
}

Assistant:

DISPOSITION_HANDLE disposition_create(role role_value, delivery_number first_value)
{
    DISPOSITION_INSTANCE* disposition_instance = (DISPOSITION_INSTANCE*)malloc(sizeof(DISPOSITION_INSTANCE));
    if (disposition_instance != NULL)
    {
        disposition_instance->composite_value = amqpvalue_create_composite_with_ulong_descriptor(21);
        if (disposition_instance->composite_value == NULL)
        {
            free(disposition_instance);
            disposition_instance = NULL;
        }
        else
        {
            AMQP_VALUE role_amqp_value;
            AMQP_VALUE first_amqp_value;
            int result = 0;

            role_amqp_value = amqpvalue_create_role(role_value);
            if ((result == 0) && (amqpvalue_set_composite_item(disposition_instance->composite_value, 0, role_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }
            first_amqp_value = amqpvalue_create_delivery_number(first_value);
            if ((result == 0) && (amqpvalue_set_composite_item(disposition_instance->composite_value, 1, first_amqp_value) != 0))
            {
                result = MU_FAILURE;
            }

            amqpvalue_destroy(role_amqp_value);
            amqpvalue_destroy(first_amqp_value);
            if (result != 0)
            {
                disposition_destroy(disposition_instance);
                disposition_instance = NULL;
            }
        }
    }

    return disposition_instance;
}